

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

L2NormalizeLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::L2NormalizeLayerParams>
          (Arena *arena)

{
  L2NormalizeLayerParams *pLVar1;
  
  if (arena != (Arena *)0x0) {
    pLVar1 = DoCreateMessage<CoreML::Specification::L2NormalizeLayerParams>(arena);
    return pLVar1;
  }
  pLVar1 = (L2NormalizeLayerParams *)operator_new(0x18);
  CoreML::Specification::L2NormalizeLayerParams::L2NormalizeLayerParams(pLVar1,(Arena *)0x0,false);
  return pLVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }